

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

texts * lest::tags(texts *__return_storage_ptr__,text *name,texts *result)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  text local_88 [48];
  value_type local_58 [32];
  size_t local_38;
  size_t rb;
  size_t lb;
  size_t none;
  texts *result_local;
  text *name_local;
  
  lb = 0xffffffffffffffff;
  none = (size_t)result;
  result_local = (texts *)name;
  name_local = (text *)__return_storage_ptr__;
  rb = std::__cxx11::string::find_first_of((char *)name,0x112738);
  local_38 = std::__cxx11::string::find_first_of((char *)name,0x112726);
  if ((rb == lb) || (local_38 == lb)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,result);
  }
  else {
    std::__cxx11::string::substr((ulong)local_58,(ulong)name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(result,local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::substr((ulong)local_88,(ulong)name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a0,result);
    tags(__return_storage_ptr__,local_88,&local_a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0);
    std::__cxx11::string::~string((string *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

inline texts tags( text name, texts result = texts() )
{
    size_t none = std::string::npos;
    size_t lb   = name.find_first_of( "[" );
    size_t rb   = name.find_first_of( "]" );

    if ( lb == none || rb == none )
        return result;

    result.push_back( name.substr( lb, rb - lb + 1 ) );

    return tags( name.substr( rb + 1 ), result );
}